

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O2

hs_database_t * ZiLoadDatabase(char *dbfile,bool has_header,ZiEncryptHdr *header_recver)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  void *pvVar7;
  hs_database_t *db;
  ifstream is;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Loading database from file: ");
  poVar3 = std::operator<<(poVar3,dbfile);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ifstream::ifstream(&is);
  std::ifstream::open((char *)&is,(_Ios_Openmode)dbfile);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[ ERROR ]Open ");
    poVar3 = std::operator<<(poVar3,dbfile);
    poVar3 = std::operator<<(poVar3," Failed");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::istream::seekg((long)&is,_S_beg);
    lVar4 = std::istream::tellg();
    std::istream::seekg((long)&is,_S_beg);
    if (has_header) {
      poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Deserialize: Extracting header...");
      std::endl<char,std::char_traits<char>>(poVar3);
      puVar5 = (undefined8 *)operator_new__(0xc);
      std::istream::read((char *)&is,(long)puVar5);
      if (header_recver != (ZiEncryptHdr *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Deserialize: Writing Header...");
        std::endl<char,std::char_traits<char>>(poVar3);
        *(undefined4 *)(header_recver + 7) = *(undefined4 *)((long)puVar5 + 7);
        *(undefined8 *)header_recver = *puVar5;
      }
      operator_delete__(puVar5);
      lVar6 = -0xc;
    }
    else {
      lVar6 = 0;
    }
    pvVar7 = operator_new__(lVar4 + lVar6);
    std::istream::read((char *)&is,(long)pvVar7);
    std::ifstream::close();
    iVar2 = hs_deserialize_database(pvVar7,lVar4 + lVar6);
    operator_delete__(pvVar7);
    if (iVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] Deserialize Failed with: ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
      std::endl<char,std::char_traits<char>>(poVar3);
      exit(-1);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Deserialize database successfully");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ifstream::~ifstream(&is);
  return (hs_database_t *)0x0;
}

Assistant:

hs_database_t* ZiLoadDatabase(const char* dbfile, bool has_header,
    struct ZiEncryptHdr* header_recver)
{
    cout << "[ Info ] Loading database from file: " << dbfile << endl;

    std::ifstream is;
    is.open(dbfile, ios::in | ios::binary);
    if (!is.is_open())
    {
        cerr << "[ ERROR ]Open " << dbfile << " Failed" << endl;
        return nullptr;
    }
    // Get the file's size
    is.seekg(0, ios::end);
    size_t total_len = is.tellg();
    // back to beginning and ready to read.
    is.seekg(0, ios::beg);
    // if header exists, extrace it first if @p header_recver is not nullptr
    size_t hdr_len = 0;
    if (has_header)
    {
        cout << "[ Info ] Deserialize: Extracting header..." << endl;

        hdr_len = sizeof(struct ZiEncryptHdr); // TODO assign a magic number
        char* hdr_buffer = new char[hdr_len];
        is.read(hdr_buffer, hdr_len);
        if (header_recver) // maybe assert is better
        {
            cout << "[ Info ] Deserialize: Writing Header..." << endl;
            *header_recver = *(struct ZiEncryptHdr*) hdr_buffer;
        }
        delete[] hdr_buffer;
    }
    // now read the real db data.
    size_t db_size = total_len - hdr_len;
    char* bytes = nullptr;
    bytes = new char[db_size];
    is.read(bytes, db_size);
    is.close();

    hs_database_t* db = nullptr;
    hs_error_t err = hs_deserialize_database(bytes, db_size, &db);

    delete[] bytes;

    if (err != HS_SUCCESS)
    {
        cerr << "[ ERROR ] Deserialize Failed with: " << err << endl;
        exit(-1);
    }
    cout << "[ Info ] Deserialize database successfully" << endl;

    return db;
}